

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zuncompress.c
# Opt level: O1

int unlzw(FILE *in,FILE *out)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [11];
  bool bVar27;
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  long lVar30;
  ulong uVar31;
  long lVar32;
  long lVar33;
  voidp buf;
  uint uVar34;
  uint uVar35;
  ulong uVar36;
  long lVar37;
  ush *puVar38;
  int iVar39;
  ulong uVar40;
  int iVar41;
  uint uVar42;
  uint uVar43;
  ush *puVar44;
  ush *puVar45;
  ush *puVar46;
  long lVar47;
  long lVar48;
  voidp pvVar49;
  long lVar50;
  ush *puVar51;
  undefined1 auVar52 [16];
  char cVar54;
  char cVar55;
  char cVar56;
  char cVar57;
  char cVar58;
  char cVar59;
  char cVar60;
  undefined1 auVar53 [16];
  undefined1 auVar61 [11];
  char cVar67;
  byte bVar68;
  char cVar69;
  char cVar70;
  char cVar71;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  ulong local_80;
  ulong local_70;
  undefined1 auVar62 [15];
  char cVar65;
  byte bVar66;
  
  uVar31 = (ulong)inptr;
  ofd = out;
  if (inptr < insize) {
    inptr = inptr + 1;
    maxbits = (int)inbuf[uVar31];
  }
  else {
    maxbits = fill_inbuf((int)in);
  }
  block_mode = maxbits & 0x80;
  if ((maxbits & 0x60U) != 0) {
    ffpmsg(ifname);
    ffpmsg("warning, unknown flags in unlzw decompression");
  }
  iVar41 = block_mode;
  maxbits = maxbits & 0x1f;
  uVar31 = 1L << (sbyte)maxbits;
  if ((uint)maxbits < 0x11) {
    local_80 = (ulong)insize;
    uVar42 = inptr << 3;
    lVar50 = 0x100;
    memset(prev,0,0x100);
    auVar52 = _DAT_001d7e40;
    do {
      cVar60 = auVar52[7];
      auVar17[0xd] = 0;
      auVar17._0_13_ = auVar52._0_13_;
      auVar17[0xe] = cVar60;
      cVar59 = auVar52[6];
      auVar18[0xc] = cVar59;
      auVar18._0_12_ = auVar52._0_12_;
      auVar18._13_2_ = auVar17._13_2_;
      auVar19[0xb] = 0;
      auVar19._0_11_ = auVar52._0_11_;
      auVar19._12_3_ = auVar18._12_3_;
      cVar58 = auVar52[5];
      auVar20[10] = cVar58;
      auVar20._0_10_ = auVar52._0_10_;
      auVar20._11_4_ = auVar19._11_4_;
      auVar21[9] = 0;
      auVar21._0_9_ = auVar52._0_9_;
      auVar21._10_5_ = auVar20._10_5_;
      cVar57 = auVar52[4];
      auVar22[8] = cVar57;
      auVar22._0_8_ = auVar52._0_8_;
      auVar22._9_6_ = auVar21._9_6_;
      auVar53[7] = 0;
      auVar53._0_7_ = auVar22._8_7_;
      auVar25._7_8_ = 0;
      auVar25._0_7_ = auVar22._8_7_;
      cVar56 = auVar52[3];
      auVar28._1_8_ = SUB158(auVar25 << 0x40,7);
      auVar28[0] = cVar56;
      auVar28._9_6_ = 0;
      cVar55 = auVar52[2];
      auVar26._1_10_ = SUB1510(auVar28 << 0x30,5);
      auVar26[0] = cVar55;
      auVar29._11_4_ = 0;
      auVar29._0_11_ = auVar26;
      cVar54 = auVar52[1];
      auVar23[2] = cVar54;
      auVar23._0_2_ = auVar52._0_2_;
      auVar23._3_12_ = SUB1512(auVar29 << 0x20,3);
      auVar24._2_13_ = auVar23._2_13_;
      auVar24._0_2_ = auVar52._0_2_ & 0xff;
      auVar53._8_4_ = auVar24._0_4_;
      auVar53._12_4_ = auVar26._0_4_;
      auVar53 = pshuflw(auVar53,auVar53,0x1b);
      auVar53 = pshufhw(auVar53,auVar53,0x1b);
      auVar63[8] = auVar52[8];
      auVar63[9] = 0;
      cVar65 = auVar52[9];
      auVar63[10] = cVar65;
      bVar66 = auVar52[10];
      cVar67 = auVar52[0xb];
      bVar68 = auVar52[0xc];
      auVar61._0_10_ = (unkuint10)bVar68 << 0x40;
      cVar69 = auVar52[0xd];
      auVar61[10] = cVar69;
      auVar62[0xb] = 0;
      auVar62._0_11_ = auVar61;
      cVar70 = auVar52[0xe];
      auVar62[0xc] = cVar70;
      auVar62[0xd] = 0;
      cVar71 = auVar52[0xf];
      auVar62[0xe] = cVar71;
      auVar63[3] = 0;
      auVar63._0_3_ = auVar61._8_3_;
      auVar63._4_3_ = auVar62._12_3_;
      auVar63[7] = 0;
      auVar63[0xb] = 0;
      auVar63._12_3_ = (int3)(CONCAT16(cVar67,(uint6)bVar66 << 0x20) >> 0x20);
      auVar63[0xf] = 0;
      auVar64 = pshuflw(auVar63,auVar63,0x1b);
      auVar64 = pshufhw(auVar64,auVar64,0x1b);
      sVar1 = auVar64._0_2_;
      sVar2 = auVar64._2_2_;
      sVar3 = auVar64._4_2_;
      sVar4 = auVar64._6_2_;
      sVar5 = auVar64._8_2_;
      sVar6 = auVar64._10_2_;
      sVar7 = auVar64._12_2_;
      sVar8 = auVar64._14_2_;
      sVar9 = auVar53._0_2_;
      sVar10 = auVar53._2_2_;
      sVar11 = auVar53._4_2_;
      sVar12 = auVar53._6_2_;
      sVar13 = auVar53._8_2_;
      sVar14 = auVar53._10_2_;
      sVar15 = auVar53._12_2_;
      sVar16 = auVar53._14_2_;
      *(char *)((long)prev + lVar50 + 0x1fff0) =
           (0 < sVar1) * (sVar1 < 0x100) * auVar64[0] - (0xff < sVar1);
      *(char *)((long)prev + lVar50 + 0x1fff1) =
           (0 < sVar2) * (sVar2 < 0x100) * auVar64[2] - (0xff < sVar2);
      *(char *)((long)prev + lVar50 + 0x1fff2) =
           (0 < sVar3) * (sVar3 < 0x100) * auVar64[4] - (0xff < sVar3);
      *(char *)((long)prev + lVar50 + 0x1fff3) =
           (0 < sVar4) * (sVar4 < 0x100) * auVar64[6] - (0xff < sVar4);
      *(char *)((long)prev + lVar50 + 0x1fff4) =
           (0 < sVar5) * (sVar5 < 0x100) * auVar64[8] - (0xff < sVar5);
      *(char *)((long)prev + lVar50 + 0x1fff5) =
           (0 < sVar6) * (sVar6 < 0x100) * auVar64[10] - (0xff < sVar6);
      *(char *)((long)prev + lVar50 + 0x1fff6) =
           (0 < sVar7) * (sVar7 < 0x100) * auVar64[0xc] - (0xff < sVar7);
      *(char *)((long)prev + lVar50 + 0x1fff7) =
           (0 < sVar8) * (sVar8 < 0x100) * auVar64[0xe] - (0xff < sVar8);
      *(char *)((long)prev + lVar50 + 0x1fff8) =
           (0 < sVar9) * (sVar9 < 0x100) * auVar53[0] - (0xff < sVar9);
      *(char *)((long)prev + lVar50 + 0x1fff9) =
           (0 < sVar10) * (sVar10 < 0x100) * auVar53[2] - (0xff < sVar10);
      *(char *)((long)prev + lVar50 + 0x1fffa) =
           (0 < sVar11) * (sVar11 < 0x100) * auVar53[4] - (0xff < sVar11);
      *(char *)((long)prev + lVar50 + 0x1fffb) =
           (0 < sVar12) * (sVar12 < 0x100) * auVar53[6] - (0xff < sVar12);
      *(char *)((long)prev + lVar50 + 0x1fffc) =
           (0 < sVar13) * (sVar13 < 0x100) * auVar53[8] - (0xff < sVar13);
      *(char *)((long)prev + lVar50 + 0x1fffd) =
           (0 < sVar14) * (sVar14 < 0x100) * auVar53[10] - (0xff < sVar14);
      *(char *)((long)prev + lVar50 + 0x1fffe) =
           (0 < sVar15) * (sVar15 < 0x100) * auVar53[0xc] - (0xff < sVar15);
      *(char *)((long)prev + lVar50 + 0x1ffff) =
           (0 < sVar16) * (sVar16 < 0x100) * auVar53[0xe] - (0xff < sVar16);
      auVar52[0] = auVar52[0] + -0x10;
      auVar52[1] = cVar54 + -0x10;
      auVar52[2] = cVar55 + -0x10;
      auVar52[3] = cVar56 + -0x10;
      auVar52[4] = cVar57 + -0x10;
      auVar52[5] = cVar58 + -0x10;
      auVar52[6] = cVar59 + -0x10;
      auVar52[7] = cVar60 + -0x10;
      auVar52[8] = auVar63[8] - 0x10;
      auVar52[9] = cVar65 + -0x10;
      auVar52[10] = bVar66 - 0x10;
      auVar52[0xb] = cVar67 + -0x10;
      auVar52[0xc] = bVar68 - 0x10;
      auVar52[0xd] = cVar69 + -0x10;
      auVar52[0xe] = cVar70 + -0x10;
      auVar52[0xf] = cVar71 + -0x10;
      lVar50 = lVar50 + -0x10;
    } while (lVar50 != 0);
    uVar40 = (ulong)uVar42;
    lVar50 = 0x101 - (ulong)(iVar41 == 0);
    uVar36 = 9;
    local_70 = 0x1ff;
    uVar35 = 0x1ff;
    puVar45 = (ush *)0xffffffffffffffff;
    pvVar49 = (voidp)0x0;
    uVar42 = 0;
LAB_001ba6fb:
    iVar41 = (int)uVar36;
    lVar32 = (long)iVar41;
    puVar51 = puVar45;
    do {
      iVar39 = (int)(uVar40 >> 3);
      insize = insize - iVar39;
      if (0 < (int)insize) {
        uVar40 = 0;
        do {
          lVar48 = (long)iVar39 + uVar40;
          puVar45 = (ush *)CONCAT71((int7)((ulong)lVar48 >> 8),inbuf[lVar48]);
          inbuf[uVar40] = inbuf[lVar48];
          uVar40 = uVar40 + 1;
        } while (insize != uVar40);
      }
      if (insize < 0x40) {
        puVar45 = (ush *)0x1;
        local_80 = fread(inbuf + insize,1,0x8000,(FILE *)in);
        iVar39 = (int)local_80;
        if (iVar39 != -1) {
          insize = insize + iVar39;
          bytes_in = bytes_in + iVar39;
          goto LAB_001ba7a1;
        }
        ffpmsg(ifname);
        ffpmsg("unexpected end of file");
        local_80 = 0xffffffff;
        uVar40 = 0;
LAB_001baa57:
        bVar27 = false;
      }
      else {
LAB_001ba7a1:
        uVar40 = (ulong)insize;
        if ((int)local_80 == 0) {
          lVar48 = uVar40 * 8 - (long)(iVar41 + -1);
        }
        else {
          lVar48 = (uVar40 - uVar40 % uVar36) * 8;
        }
        bVar27 = true;
        if (lVar48 < 1) {
          uVar40 = 0;
        }
        else {
          buf = (voidp)((ulong)pvVar49 & 0xffffffff);
          lVar33 = 0;
          puVar45 = puVar51;
          do {
            pvVar49 = (voidp)(long)(int)buf;
            lVar47 = (long)pvVar49 << 0x20;
            lVar30 = lVar33;
            puVar44 = puVar45;
            uVar34 = uVar42;
            while( true ) {
              lVar37 = lVar30;
              if ((long)local_70 < lVar50) {
                lVar32 = lVar33 + iVar41 * 8 + -1;
                uVar35 = iVar41 + 1;
                uVar36 = (ulong)uVar35;
                uVar40 = lVar32 - lVar32 % (long)(iVar41 * 8);
                local_70 = ~(-1L << ((byte)uVar35 & 0x3f));
                if (uVar35 == maxbits) {
                  local_70 = uVar31;
                }
                uVar35 = ~(-1 << ((byte)uVar35 & 0x1f));
                pvVar49 = buf;
                goto LAB_001ba6fb;
              }
              uVar43 = *(uint3 *)(inbuf + (lVar37 >> 3)) >> ((byte)lVar37 & 7) & uVar35;
              puVar51 = (ush *)(ulong)uVar43;
              puVar46 = puVar45;
              if (puVar44 != (ush *)0xffffffffffffffff) break;
              if (0xff < uVar43) {
                ffpmsg(ifname);
                ffpmsg("corrupt input.");
                uVar40 = lVar37 + lVar32;
                puVar51 = (ush *)0xffffffffffffffff;
                bVar27 = false;
                uVar42 = uVar34;
                goto LAB_001baaa0;
              }
              *(char *)((long)pvVar49 + 0x335240) = (char)uVar43;
              pvVar49 = (voidp)((long)pvVar49 + 1);
              lVar47 = lVar47 + 0x100000000;
              lVar30 = lVar32 + lVar37;
              puVar44 = puVar51;
              uVar34 = uVar43;
              if (lVar48 <= lVar32 + lVar37) goto LAB_001baa99;
            }
            if ((uVar43 == 0x100) && (block_mode != 0)) {
              memset(prev,0,0x100);
              lVar50 = 0x100;
              lVar32 = lVar37 + lVar32 + (iVar41 << 3) + -1;
              uVar40 = lVar32 - lVar32 % (long)(iVar41 << 3);
              uVar35 = 0x1ff;
              local_70 = 0x1ff;
              uVar36 = 9;
              puVar45 = puVar44;
              pvVar49 = (voidp)((ulong)pvVar49 & 0xffffffff);
              uVar42 = uVar34;
              goto LAB_001ba6fb;
            }
            lVar33 = 0x349a3e;
            puVar38 = puVar51;
            if (lVar50 <= (long)puVar51) {
              if (lVar50 < (long)puVar51) {
                if (0 < (long)pvVar49) {
                  write_buf((voidp)((ulong)pvVar49 & 0xffffffff),(uint)puVar45);
                  bytes_out = bytes_out + ((ulong)pvVar49 & 0xffffffff);
                }
                uVar40 = lVar37 + lVar32;
                ffpmsg(ifname);
                ffpmsg("corrupt input.");
                puVar51 = puVar44;
                uVar42 = uVar34;
                goto LAB_001baa57;
              }
              d_buf[0x7ffe]._1_1_ = (undefined1)uVar34;
              lVar33 = 0x349a3d;
              puVar38 = puVar44;
            }
            if ((ush *)0xff < puVar38) {
              puVar46 = prev;
              do {
                *(char *)(lVar33 + -1) = (char)puVar38[0x192920];
                lVar33 = lVar33 + -1;
                puVar38 = (ush *)(ulong)prev[(long)puVar38];
              } while ((ush *)0xff < puVar38);
            }
            bVar66 = (byte)puVar38[0x192920];
            puVar45 = (ush *)(lVar33 + -1);
            *(byte *)(lVar33 + -1) = bVar66;
            uVar34 = 0x349a3e - (int)puVar45;
            uVar42 = ((int)pvVar49 - (int)lVar33) + 0x349a3f;
            buf = (voidp)(ulong)uVar42;
            if ((int)uVar42 < 0x4000) {
              memcpy(outbuf + (lVar47 >> 0x20),puVar45,(long)(int)uVar34);
              puVar46 = puVar45;
            }
            else {
              buf = (voidp)((ulong)pvVar49 & 0xffffffff);
              do {
                iVar39 = (int)buf;
                uVar42 = 0x4000U - iVar39;
                if ((int)uVar34 < (int)(0x4000U - iVar39)) {
                  uVar42 = uVar34;
                }
                if (0 < (int)uVar42) {
                  puVar46 = puVar45;
                  memcpy(outbuf + iVar39,puVar45,(ulong)uVar42);
                  buf = (voidp)(ulong)(iVar39 + uVar42);
                }
                if (0x3fff < (int)buf) {
                  write_buf(buf,(uint)puVar46);
                  bytes_out = bytes_out + (long)buf;
                  buf = (voidp)0x0;
                }
                puVar45 = (ush *)((long)puVar45 + (long)(int)uVar42);
                uVar34 = 0x349a3e - (int)puVar45;
              } while (0 < (int)uVar34);
            }
            if (lVar50 < (long)uVar31) {
              prev[lVar50] = (ush)puVar44;
              window[lVar50] = bVar66;
              lVar50 = lVar50 + 1;
            }
            lVar33 = lVar32 + lVar37;
            uVar43 = (uint)bVar66;
            puVar45 = puVar51;
            pvVar49 = buf;
            uVar42 = uVar43;
          } while (lVar33 < lVar48);
LAB_001baa99:
          uVar40 = lVar37 + lVar32;
          bVar27 = true;
          puVar45 = puVar46;
          uVar42 = uVar43;
        }
      }
LAB_001baaa0:
      if (!bVar27) goto LAB_001ba61c;
    } while ((int)local_80 != 0);
    iVar41 = 0;
    if (0 < (int)pvVar49) {
      write_buf((voidp)((ulong)pvVar49 & 0xffffffff),(uint)puVar45);
      bytes_out = bytes_out + ((ulong)pvVar49 & 0xffffffff);
      iVar41 = 0;
    }
  }
  else {
    ffpmsg(ifname);
    ffpmsg("compressed with too many bits; cannot handle file");
LAB_001ba61c:
    iVar41 = 1;
  }
  return iVar41;
}

Assistant:

local int unlzw(FILE *in, FILE *out) 
    /* input and output file descriptors */
{
    REG2   char_type  *stackp;
    REG3   code_int   code;
    REG4   int        finchar;
    REG5   code_int   oldcode;
    REG6   code_int   incode;
    REG7   long       inbits;
    REG8   long       posbits;
    REG9   int        outpos;
/*  REG10  int        insize; (global) */
    REG11  unsigned   bitmask;
    REG12  code_int   free_ent;
    REG13  code_int   maxcode;
    REG14  code_int   maxmaxcode;
    REG15  int        n_bits;
    REG16  int        rsize;
    
    ofd = out;

#ifdef MAXSEG_64K
    tab_prefix[0] = tab_prefix0;
    tab_prefix[1] = tab_prefix1;
#endif
    maxbits = get_byte();
    block_mode = maxbits & BLOCK_MODE;
    if ((maxbits & LZW_RESERVED) != 0) {
	error( "warning, unknown flags in unlzw decompression");
    }
    maxbits &= BIT_MASK;
    maxmaxcode = MAXCODE(maxbits);
    
    if (maxbits > BITS) {
	error("compressed with too many bits; cannot handle file");
	exit_code = ERROR;
	return ERROR;
    }
    rsize = insize;
    maxcode = MAXCODE(n_bits = INIT_BITS)-1;
    bitmask = (1<<n_bits)-1;
    oldcode = -1;
    finchar = 0;
    outpos = 0;
    posbits = inptr<<3;

    free_ent = ((block_mode) ? FIRST : 256);
    
    clear_tab_prefixof(); /* Initialize the first 256 entries in the table. */
    
    for (code = 255 ; code >= 0 ; --code) {
	tab_suffixof(code) = (char_type)code;
    }
    do {
	REG1 int i;
	int  e;
	int  o;
	
    resetbuf:
	e = insize-(o = (posbits>>3));
	
	for (i = 0 ; i < e ; ++i) {
	    inbuf[i] = inbuf[i+o];
	}
	insize = e;
	posbits = 0;
	
	if (insize < INBUF_EXTRA) {
/*  modified to use fread instead of read - WDP 10/22/97  */
/*	    if ((rsize = read(in, (char*)inbuf+insize, INBUFSIZ)) == EOF) { */

	    if ((rsize = fread((char*)inbuf+insize, 1, INBUFSIZ, in)) == EOF) {
		error("unexpected end of file");
	        exit_code = ERROR;
                return ERROR;
	    }
	    insize += rsize;
	    bytes_in += (ulg)rsize;
	}
	inbits = ((rsize != 0) ? ((long)insize - insize%n_bits)<<3 : 
		  ((long)insize<<3)-(n_bits-1));
	
	while (inbits > posbits) {
	    if (free_ent > maxcode) {
		posbits = ((posbits-1) +
			   ((n_bits<<3)-(posbits-1+(n_bits<<3))%(n_bits<<3)));
		++n_bits;
		if (n_bits == maxbits) {
		    maxcode = maxmaxcode;
		} else {
		    maxcode = MAXCODE(n_bits)-1;
		}
		bitmask = (1<<n_bits)-1;
		goto resetbuf;
	    }
	    input(inbuf,posbits,code,n_bits,bitmask);
	    Tracev((stderr, "%d ", code));

	    if (oldcode == -1) {
		if (code >= 256) {
                    error("corrupt input.");
	            exit_code = ERROR;
                    return ERROR;
                }

		outbuf[outpos++] = (char_type)(finchar = (int)(oldcode=code));
		continue;
	    }
	    if (code == CLEAR && block_mode) {
		clear_tab_prefixof();
		free_ent = FIRST - 1;
		posbits = ((posbits-1) +
			   ((n_bits<<3)-(posbits-1+(n_bits<<3))%(n_bits<<3)));
		maxcode = MAXCODE(n_bits = INIT_BITS)-1;
		bitmask = (1<<n_bits)-1;
		goto resetbuf;
	    }
	    incode = code;
	    stackp = de_stack;
	    
	    if (code >= free_ent) { /* Special case for KwKwK string. */
		if (code > free_ent) {
		    if (outpos > 0) {
			write_buf((char*)outbuf, outpos);
			bytes_out += (ulg)outpos;
		    }
		    error("corrupt input.");
	            exit_code = ERROR;
                    return ERROR;

		}
		*--stackp = (char_type)finchar;
		code = oldcode;
	    }

	    while ((cmp_code_int)code >= (cmp_code_int)256) {
		/* Generate output characters in reverse order */
		*--stackp = tab_suffixof(code);
		code = tab_prefixof(code);
	    }
	    *--stackp =	(char_type)(finchar = tab_suffixof(code));
	    
	    /* And put them out in forward order */
	    {
	/*	REG1 int	i;   already defined above (WDP) */
	    
		if (outpos+(i = (de_stack-stackp)) >= OUTBUFSIZ) {
		    do {
			if (i > OUTBUFSIZ-outpos) i = OUTBUFSIZ-outpos;

			if (i > 0) {
			    memcpy(outbuf+outpos, stackp, i);
			    outpos += i;
			}
			if (outpos >= OUTBUFSIZ) {
			    write_buf((char*)outbuf, outpos);
			    bytes_out += (ulg)outpos;
			    outpos = 0;
			}
			stackp+= i;
		    } while ((i = (de_stack-stackp)) > 0);
		} else {
		    memcpy(outbuf+outpos, stackp, i);
		    outpos += i;
		}
	    }

	    if ((code = free_ent) < maxmaxcode) { /* Generate the new entry. */

		tab_prefixof(code) = (unsigned short)oldcode;
		tab_suffixof(code) = (char_type)finchar;
		free_ent = code+1;
	    } 
	    oldcode = incode;	/* Remember previous code.	*/
	}
    } while (rsize != 0);
    
    if (outpos > 0) {
	write_buf((char*)outbuf, outpos);
	bytes_out += (ulg)outpos;
    }
    return OK;
}